

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O2

int ptls_load_pem_objects
              (char *pem_fname,char *label,ptls_iovec_t *list,size_t list_max,size_t *nb_objects)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  ulong uVar4;
  bool bVar5;
  ptls_base64_decode_state_t local_188;
  size_t *local_170;
  ptls_iovec_t *local_168;
  size_t local_160;
  ptls_buffer_t buf;
  char line [256];
  
  local_168 = list;
  local_160 = list_max;
  __stream = fopen(pem_fname,"r");
  *nb_objects = 0;
  if (__stream == (FILE *)0x0) {
    iVar1 = -1;
    bVar5 = false;
LAB_00107103:
    iVar2 = 0;
    if (iVar1 != 0x233) {
      iVar2 = iVar1;
    }
    if (!bVar5) {
      iVar2 = iVar1;
    }
    return iVar2;
  }
  uVar4 = 0;
  local_170 = nb_objects;
LAB_00106fbc:
  if (uVar4 < local_160) {
    buf.base = "";
    buf.capacity = 0;
    buf.off = 0;
    buf.is_allocated = 0;
    do {
      pcVar3 = fgets(line,0x100,__stream);
      if (pcVar3 == (char *)0x0) {
        iVar1 = 0x233;
        goto LAB_00107025;
      }
      iVar1 = ptls_compare_separator_line(line,"BEGIN",label);
    } while (iVar1 != 0);
    local_188.nbc = 0;
    local_188.nbo = 3;
    local_188.status = 1;
    local_188.v = 0;
    iVar1 = 0;
LAB_00107025:
    do {
      if (iVar1 != 0) goto LAB_001070d2;
      pcVar3 = fgets(line,0x100,__stream);
      if (pcVar3 == (char *)0x0) goto LAB_00107086;
      iVar1 = ptls_compare_separator_line(line,"END",label);
      if (iVar1 == 0) goto LAB_0010706c;
      iVar1 = ptls_base64_decode(line,&local_188,&buf);
    } while( true );
  }
  iVar1 = 0;
LAB_001070e4:
  *local_170 = uVar4;
  fclose(__stream);
  bVar5 = uVar4 != 0;
  goto LAB_00107103;
LAB_0010706c:
  if ((local_188.status != 0) && ((iVar1 = 0x232, local_188.status != 1 || (local_188.nbc != 0)))) {
LAB_001070d2:
    ptls_buffer_dispose(&buf);
    goto LAB_001070e4;
  }
LAB_00107086:
  if ((buf.off == 0) || (buf.is_allocated == 0)) {
    ptls_buffer_dispose(&buf);
  }
  else {
    local_168[uVar4].base = buf.base;
    local_168[uVar4].len = buf.off;
    uVar4 = uVar4 + 1;
  }
  goto LAB_00106fbc;
}

Assistant:

int ptls_load_pem_objects(char const *pem_fname, const char *label, ptls_iovec_t *list, size_t list_max, size_t *nb_objects)
{
    FILE *F;
    int ret = 0;
    size_t count = 0;
#ifdef _WINDOWS
    errno_t err = fopen_s(&F, pem_fname, "r");
    if (err != 0) {
        ret = -1;
    }
#else
    F = fopen(pem_fname, "r");
    if (F == NULL) {
        ret = -1;
    }
#endif

    *nb_objects = 0;

    if (ret == 0) {
        while (count < list_max) {
            ptls_buffer_t buf;

            ptls_buffer_init(&buf, "", 0);

            ret = ptls_get_pem_object(F, label, &buf);

            if (ret == 0) {
                if (buf.off > 0 && buf.is_allocated) {
                    list[count].base = buf.base;
                    list[count].len = buf.off;
                    count++;
                } else {
                    ptls_buffer_dispose(&buf);
                }
            } else {
                ptls_buffer_dispose(&buf);
                break;
            }
        }
    }

    if (ret == PTLS_ERROR_PEM_LABEL_NOT_FOUND && count > 0) {
        ret = 0;
    }

    *nb_objects = count;

    if (F != NULL) {
        fclose(F);
    }

    return ret;
}